

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

void tt_delta_interpolate
               (int p1,int p2,int ref1,int ref2,FT_Vector *in_points,FT_Vector *out_points)

{
  FT_Vector *pFVar1;
  FT_Vector *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  FT_Long FVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  if (p1 <= p2) {
    lVar14 = 0;
    bVar8 = true;
    do {
      bVar7 = bVar8;
      pFVar1 = (FT_Vector *)(&in_points->x + lVar14);
      iVar11 = ref2;
      if (pFVar1[ref2].x < pFVar1[ref1].x) {
        iVar11 = ref1;
      }
      pFVar2 = (FT_Vector *)(&out_points->x + lVar14);
      if (pFVar1[ref2].x < pFVar1[ref1].x) {
        ref1 = ref2;
      }
      lVar3 = pFVar1[ref1].x;
      lVar4 = pFVar1[iVar11].x;
      lVar5 = pFVar2[ref1].x;
      lVar6 = pFVar2[iVar11].x;
      if ((lVar4 != lVar3) || (lVar6 == lVar5)) {
        if (lVar4 - lVar3 == 0) {
          lVar10 = 0;
        }
        else {
          FVar9 = FT_DivFix(lVar6 - lVar5,lVar4 - lVar3);
          lVar10 = (long)(int)FVar9;
        }
        lVar14 = (long)p1 * 0x10 + lVar14 * 8;
        iVar12 = (p2 - p1) + 1;
        do {
          lVar13 = *(long *)((long)&in_points->x + lVar14);
          if (lVar3 < lVar13) {
            if (lVar13 < lVar4) {
              lVar13 = ((int)lVar13 - (int)lVar3) * lVar10;
              lVar13 = (int)((ulong)(lVar13 + (lVar13 >> 0x3f) + 0x8000) >> 0x10) + lVar5;
            }
            else {
              lVar13 = lVar13 + (lVar6 - lVar4);
            }
          }
          else {
            lVar13 = lVar13 + (lVar5 - lVar3);
          }
          *(long *)((long)&out_points->x + lVar14) = lVar13;
          lVar14 = lVar14 + 0x10;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      lVar14 = 1;
      in_points = pFVar1;
      out_points = pFVar2;
      ref2 = iVar11;
      bVar8 = false;
    } while (bVar7);
  }
  return;
}

Assistant:

static void
  tt_delta_interpolate( int         p1,
                        int         p2,
                        int         ref1,
                        int         ref2,
                        FT_Vector*  in_points,
                        FT_Vector*  out_points )
  {
    int  p, i;

    FT_Pos  out, in1, in2, out1, out2, d1, d2;


    if ( p1 > p2 )
      return;

    /* handle both horizontal and vertical coordinates */
    for ( i = 0; i <= 1; i++ )
    {
      /* shift array pointers so that we can access `foo.y' as `foo.x' */
      in_points  = (FT_Vector*)( (FT_Pos*)in_points + i );
      out_points = (FT_Vector*)( (FT_Pos*)out_points + i );

      if ( in_points[ref1].x > in_points[ref2].x )
      {
        p    = ref1;
        ref1 = ref2;
        ref2 = p;
      }

      in1  = in_points[ref1].x;
      in2  = in_points[ref2].x;
      out1 = out_points[ref1].x;
      out2 = out_points[ref2].x;
      d1   = out1 - in1;
      d2   = out2 - in2;

      /* If the reference points have the same coordinate but different */
      /* delta, inferred delta is zero.  Otherwise interpolate.         */
      if ( in1 != in2 || out1 == out2 )
      {
        FT_Fixed  scale = in1 != in2 ? FT_DivFix( out2 - out1, in2 - in1 )
                                     : 0;


        for ( p = p1; p <= p2; p++ )
        {
          out = in_points[p].x;

          if ( out <= in1 )
            out += d1;
          else if ( out >= in2 )
            out += d2;
          else
            out = out1 + FT_MulFix( out - in1, scale );

          out_points[p].x = out;
        }
      }
    }
  }